

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void txfm_partition_update
               (TXFM_CONTEXT *above_ctx,TXFM_CONTEXT *left_ctx,TX_SIZE tx_size,TX_SIZE txb_size)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int i;
  uint8_t txh;
  uint8_t txw;
  int bw;
  int bh;
  BLOCK_SIZE bsize;
  TX_SIZE txb_size_local;
  TX_SIZE tx_size_local;
  TXFM_CONTEXT *left_ctx_local;
  TXFM_CONTEXT *above_ctx_local;
  
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [txsize_to_bsize[txb_size]];
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [txsize_to_bsize[txb_size]];
  iVar3 = tx_size_wide[tx_size];
  iVar4 = tx_size_high[tx_size];
  for (i = 0; i < (int)(uint)bVar1; i = i + 1) {
    left_ctx[i] = (TXFM_CONTEXT)iVar4;
  }
  for (i = 0; i < (int)(uint)bVar2; i = i + 1) {
    above_ctx[i] = (TXFM_CONTEXT)iVar3;
  }
  return;
}

Assistant:

static inline void txfm_partition_update(TXFM_CONTEXT *above_ctx,
                                         TXFM_CONTEXT *left_ctx,
                                         TX_SIZE tx_size, TX_SIZE txb_size) {
  BLOCK_SIZE bsize = txsize_to_bsize[txb_size];
  int bh = mi_size_high[bsize];
  int bw = mi_size_wide[bsize];
  uint8_t txw = tx_size_wide[tx_size];
  uint8_t txh = tx_size_high[tx_size];
  int i;
  for (i = 0; i < bh; ++i) left_ctx[i] = txh;
  for (i = 0; i < bw; ++i) above_ctx[i] = txw;
}